

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::AddSnappedEdge
          (S2Builder *this,SiteId src,SiteId dst,InputEdgeIdSetId id,EdgeType edge_type,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges,
          vector<int,_std::allocator<int>_> *input_edge_ids)

{
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *this_00;
  int32 local_3c;
  pair<int,_int> local_38;
  pair<int,_int> local_30;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_28;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *edges_local;
  EdgeType edge_type_local;
  InputEdgeIdSetId id_local;
  SiteId dst_local;
  SiteId src_local;
  S2Builder *this_local;
  
  local_28 = edges;
  edges_local._0_4_ = edge_type;
  edges_local._4_4_ = id;
  edge_type_local = dst;
  id_local = src;
  _dst_local = this;
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_30,&id_local,(int *)&edge_type_local);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            (edges,&local_30);
  std::vector<int,_std::allocator<int>_>::push_back
            (input_edge_ids,(value_type_conflict1 *)((long)&edges_local + 4));
  this_00 = local_28;
  if ((EdgeType)edges_local == UNDIRECTED) {
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_38,(int *)&edge_type_local,&id_local);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              (this_00,&local_38);
    local_3c = IdSetLexicon::EmptySetId();
    std::vector<int,_std::allocator<int>_>::push_back(input_edge_ids,&local_3c);
  }
  return;
}

Assistant:

inline void S2Builder::AddSnappedEdge(
    SiteId src, SiteId dst, InputEdgeIdSetId id, EdgeType edge_type,
    vector<Edge>* edges, vector<InputEdgeIdSetId>* input_edge_ids) const {
  edges->push_back(Edge(src, dst));
  input_edge_ids->push_back(id);
  if (edge_type == EdgeType::UNDIRECTED) {
    edges->push_back(Edge(dst, src));
    // Automatically created edges do not have input edge ids or labels.  This
    // can be used to distinguish the original direction of the undirected edge.
    input_edge_ids->push_back(IdSetLexicon::EmptySetId());
  }
}